

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O2

int __thiscall
vkt::sr::anon_unknown_0::ShaderIndexingTests::init(ShaderIndexingTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  char *pcVar2;
  TestContext *pTVar3;
  uint uVar4;
  int iVar5;
  DataType dataType;
  int extraout_EAX;
  TestCaseGroup *pTVar6;
  char *pcVar7;
  TestNode *pTVar8;
  ShaderEvalFunc p_Var9;
  char *pcVar10;
  char *__s;
  ostream *poVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  char *pcVar16;
  long lVar17;
  long lVar18;
  string *psVar19;
  ostringstream *poVar20;
  allocator<char> local_4ca;
  allocator<char> local_4c9;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  StringTemplate fragTemplate;
  int local_460;
  string vertexShaderSource;
  StringTemplate vertTemplate;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> varyingGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> vecGroup;
  string local_3a8;
  string desc;
  string name;
  ostringstream vtx;
  ostringstream frag;
  string local_50;
  
  pTVar6 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"varying_array",
             "Varying array access tests.");
  lVar13 = 0;
  varyingGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar6;
  do {
    pTVar6 = varyingGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    if (lVar13 == 4) {
      varyingGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild((TestNode *)this,&pTVar6->super_TestNode);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&varyingGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      pTVar6 = (TestCaseGroup *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                (pTVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"uniform_array",
                 "Uniform array access tests.");
      lVar13 = 0;
      varyingGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = pTVar6;
      do {
        pTVar6 = varyingGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr;
        if (lVar13 == 4) {
          varyingGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
          .m_data.ptr = (TestCaseGroup *)0x0;
          tcu::TestNode::addChild((TestNode *)this,&pTVar6->super_TestNode);
          de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
          ~UniqueBase(&varyingGroup.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                     );
          pTVar6 = (TestCaseGroup *)operator_new(0x70);
          tcu::TestCaseGroup::TestCaseGroup
                    (pTVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"tmp_array",
                     "Temporary array access tests.");
          varyingGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
          .m_data.ptr = pTVar6;
          for (lVar13 = 0;
              pTVar6 = varyingGroup.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data.ptr, lVar13 != 4; lVar13 = lVar13 + 1) {
            DVar1 = sr::(anonymous_namespace)::ShaderOperatorTests::init()::s_floatTypes[lVar13];
            for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
              pcVar2 = (&sr::(anonymous_namespace)::
                         getIndexAccessTypeName(vkt::sr::(anonymous_namespace)::IndexAccessType)::
                         s_names)[lVar14];
              pcVar12 = "\tfor (int i = 0; i < ui_four; i++)\n";
              if (lVar14 == 2) {
                pcVar12 = "\tfor (int i = 0; i < 4; i++)\n";
              }
              for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
                pcVar16 = (&sr::(anonymous_namespace)::
                            getIndexAccessTypeName(vkt::sr::(anonymous_namespace)::IndexAccessType)
                            ::s_names)[lVar18];
                pcVar7 = "\tfor (int i = 0; i < ui_four; i++)\n";
                if (lVar18 == 2) {
                  pcVar7 = "\tfor (int i = 0; i < 4; i++)\n";
                }
                for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 4) {
                  pcVar10 = glu::getShaderTypeName
                                      (*(ShaderType *)
                                        ((long)tessellation::
                                               createCommonEdgeTests(tcu::TestContext&)::
                                               primitiveTypes + lVar17));
                  __s = glu::getDataTypeName(DVar1);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&vertexShaderSource,__s,(allocator<char> *)&local_3a8);
                  std::operator+(&fragTemplate.m_template,&vertexShaderSource,"_");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&params,&fragTemplate.m_template,pcVar2);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&params,"_write_");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&vertTemplate,pcVar16);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vtx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&frag,"_read_");
                  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&vtx,pcVar10);
                  std::__cxx11::string::~string((string *)&vtx);
                  std::__cxx11::string::~string((string *)&frag);
                  std::__cxx11::string::~string((string *)&vertTemplate);
                  std::__cxx11::string::~string((string *)&params);
                  std::__cxx11::string::~string((string *)&fragTemplate.m_template);
                  std::__cxx11::string::~string((string *)&vertexShaderSource);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&vertexShaderSource,"Temporary array with ",
                             (allocator<char> *)&local_3a8);
                  std::operator+(&fragTemplate.m_template,&vertexShaderSource,pcVar2);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&params,&fragTemplate.m_template," write and ");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&params,pcVar16);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&vertTemplate," read in ");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vtx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&frag,pcVar10);
                  std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&vtx," shader.");
                  std::__cxx11::string::~string((string *)&vtx);
                  std::__cxx11::string::~string((string *)&frag);
                  std::__cxx11::string::~string((string *)&vertTemplate);
                  std::__cxx11::string::~string((string *)&params);
                  std::__cxx11::string::~string((string *)&fragTemplate);
                  std::__cxx11::string::~string((string *)&vertexShaderSource);
                  pTVar3 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
                  psVar19 = (string *)&frag;
                  if (lVar17 == 0) {
                    psVar19 = (string *)&vtx;
                  }
                  std::operator<<((ostream *)&vtx,"#version 310 es\n");
                  std::operator<<((ostream *)&frag,"#version 310 es\n");
                  std::operator<<((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n"
                                 );
                  std::operator<<((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n");
                  std::operator<<((ostream *)&frag,
                                  "layout(location = 0) out mediump vec4 o_color;\n");
                  if (lVar17 == 0) {
                    std::operator<<((ostream *)&vtx,
                                    "layout(location = 0) out mediump vec4 v_color;\n");
                    pcVar10 = "layout(location = 0) in mediump vec4 v_color;\n";
                  }
                  else {
                    std::operator<<((ostream *)&vtx,
                                    "layout(location = 0) out mediump vec4 v_coords;\n");
                    pcVar10 = "layout(location = 0) in mediump vec4 v_coords;\n";
                  }
                  std::operator<<((ostream *)&frag,pcVar10);
                  if (lVar18 == 1 || lVar14 == 1) {
                    std::operator<<((ostream *)psVar19,
                                    "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n"
                                   );
                    std::operator<<((ostream *)psVar19,
                                    "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n"
                                   );
                    std::operator<<((ostream *)psVar19,
                                    "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n"
                                   );
                    std::operator<<((ostream *)psVar19,
                                    "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n"
                                   );
                  }
                  if (lVar18 == 3 || lVar14 == 3) {
                    std::operator<<((ostream *)psVar19,
                                    "layout(std140, binding = 4) uniform something4 { mediump int ui_four; };\n"
                                   );
                  }
                  std::operator<<((ostream *)&vtx,"\n");
                  std::operator<<((ostream *)&vtx,"void main()\n");
                  std::operator<<((ostream *)&vtx,"{\n");
                  std::operator<<((ostream *)&vtx,"\tgl_Position = a_position;\n");
                  std::operator<<((ostream *)&frag,"\n");
                  std::operator<<((ostream *)&frag,"void main()\n");
                  std::operator<<((ostream *)&frag,"{\n");
                  pcVar10 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
                  if (lVar17 == 0) {
                    pcVar10 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
                  }
                  std::operator<<((ostream *)psVar19,pcVar10);
                  std::operator<<((ostream *)psVar19,
                                  "\t${PRECISION} ${VAR_TYPE} arr[${ARRAY_LEN}];\n");
                  if (lVar14 == 0) {
                    std::operator<<((ostream *)psVar19,"\tarr[0] = ${VAR_TYPE}(coords);\n");
                    std::operator<<((ostream *)psVar19,"\tarr[1] = ${VAR_TYPE}(coords) * 0.5;\n");
                    std::operator<<((ostream *)psVar19,"\tarr[2] = ${VAR_TYPE}(coords) * 0.25;\n");
                    pcVar10 = "\tarr[3] = ${VAR_TYPE}(coords) * 0.125;\n";
                  }
                  else if (lVar14 == 1) {
                    std::operator<<((ostream *)psVar19,"\tarr[ui_zero]  = ${VAR_TYPE}(coords);\n");
                    std::operator<<((ostream *)psVar19,
                                    "\tarr[ui_one]   = ${VAR_TYPE}(coords) * 0.5;\n");
                    std::operator<<((ostream *)psVar19,
                                    "\tarr[ui_two]   = ${VAR_TYPE}(coords) * 0.25;\n");
                    pcVar10 = "\tarr[ui_three] = ${VAR_TYPE}(coords) * 0.125;\n";
                  }
                  else {
                    std::operator<<((ostream *)psVar19,pcVar12);
                    std::operator<<((ostream *)psVar19,"\t{\n");
                    std::operator<<((ostream *)psVar19,"\t\tarr[i] = ${VAR_TYPE}(coords);\n");
                    std::operator<<((ostream *)psVar19,"\t\tcoords = coords * 0.5;\n");
                    pcVar10 = "\t}\n";
                  }
                  std::operator<<((ostream *)psVar19,pcVar10);
                  std::operator<<((ostream *)psVar19,
                                  "\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n");
                  if (lVar18 == 0) {
                    std::operator<<((ostream *)psVar19,"\tres += arr[0];\n");
                    std::operator<<((ostream *)psVar19,"\tres += arr[1];\n");
                    std::operator<<((ostream *)psVar19,"\tres += arr[2];\n");
                    pcVar10 = "\tres += arr[3];\n";
                  }
                  else if (lVar18 == 1) {
                    std::operator<<((ostream *)psVar19,"\tres += arr[ui_zero];\n");
                    std::operator<<((ostream *)psVar19,"\tres += arr[ui_one];\n");
                    std::operator<<((ostream *)psVar19,"\tres += arr[ui_two];\n");
                    pcVar10 = "\tres += arr[ui_three];\n";
                  }
                  else {
                    std::operator<<((ostream *)psVar19,pcVar7);
                    pcVar10 = "\t\tres += arr[i];\n";
                  }
                  std::operator<<((ostream *)psVar19,pcVar10);
                  if (lVar17 == 0) {
                    std::operator<<((ostream *)&vtx,"\tv_color = vec4(res${PADDING});\n");
                    pcVar10 = "\to_color = v_color;\n";
                  }
                  else {
                    std::operator<<((ostream *)&vtx,"\tv_coords = a_coords;\n");
                    pcVar10 = "\to_color = vec4(res${PADDING});\n";
                  }
                  std::operator<<((ostream *)&frag,pcVar10);
                  std::operator<<((ostream *)&vtx,"}\n");
                  std::operator<<((ostream *)&frag,"}\n");
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &params._M_t._M_impl.super__Rb_tree_header._M_header;
                  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<const_char_(&)[9],_const_char_*,_true>
                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate,(char (*) [9])0x991f0e,(char **)&fragTemplate);
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              *)&params,
                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&vertTemplate);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x9971d4);
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              *)&params,
                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&vertTemplate);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate,(char (*) [10])0x991f1f,(char (*) [8])0x9ce6fa);
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              *)&params,
                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&vertTemplate);
                  if (DVar1 == TYPE_FLOAT_VEC3) {
                    std::
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x99ba18);
                    std::
                    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                *)&params,
                               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&vertTemplate);
                  }
                  else if (DVar1 == TYPE_FLOAT_VEC2) {
                    std::
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x99ba13);
                    std::
                    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                *)&params,
                               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&vertTemplate);
                  }
                  else if (DVar1 == TYPE_FLOAT) {
                    std::
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])0x99ba64);
                    std::
                    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                *)&params,
                               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&vertTemplate);
                  }
                  else {
                    std::
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])0x93caf3);
                    std::
                    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                *)&params,
                               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&vertTemplate);
                  }
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&vertTemplate);
                  std::__cxx11::stringbuf::str();
                  tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
                  std::__cxx11::string::~string((string *)&fragTemplate.m_template);
                  std::__cxx11::stringbuf::str();
                  tcu::StringTemplate::StringTemplate
                            ((StringTemplate *)&fragTemplate.m_template,&vertexShaderSource);
                  std::__cxx11::string::~string((string *)&vertexShaderSource);
                  tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
                  tcu::StringTemplate::specialize(&local_3a8,&fragTemplate,&params);
                  pTVar8 = (TestNode *)operator_new(0xe0);
                  p_Var9 = getArrayCoordsEvalFunc(DVar1);
                  ShaderIndexingCase::ShaderIndexingCase
                            ((ShaderIndexingCase *)pTVar8,pTVar3,&name,&desc,lVar17 == 0,p_Var9,
                             &vertexShaderSource,&local_3a8,DVar1,false);
                  std::__cxx11::string::~string((string *)&local_3a8);
                  std::__cxx11::string::~string((string *)&vertexShaderSource);
                  tcu::StringTemplate::~StringTemplate(&fragTemplate);
                  tcu::StringTemplate::~StringTemplate(&vertTemplate);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~_Rb_tree(&params._M_t);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
                  tcu::TestNode::addChild
                            (&(varyingGroup.
                               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                               .m_data.ptr)->super_TestNode,pTVar8);
                  std::__cxx11::string::~string((string *)&desc);
                  std::__cxx11::string::~string((string *)&name);
                }
              }
            }
          }
          varyingGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
          .m_data.ptr = (TestCaseGroup *)0x0;
          tcu::TestNode::addChild((TestNode *)this,&pTVar6->super_TestNode);
          de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
          ~UniqueBase(&varyingGroup.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                     );
          pTVar6 = (TestCaseGroup *)operator_new(0x70);
          tcu::TestCaseGroup::TestCaseGroup
                    (pTVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"vector_subscript",
                     "Vector subscript indexing.");
          lVar13 = 0;
          vecGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
          m_data.ptr = pTVar6;
          do {
            pTVar6 = vecGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr;
            if (lVar13 == 3) {
              vecGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
              .m_data.ptr = (TestCaseGroup *)0x0;
              tcu::TestNode::addChild((TestNode *)this,&pTVar6->super_TestNode);
              de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              ~UniqueBase(&vecGroup.
                           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         );
              pTVar6 = (TestCaseGroup *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        (pTVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                         "matrix_subscript","Matrix subscript indexing.");
              lVar13 = 0;
              vecGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
              .m_data.ptr = pTVar6;
              do {
                pTVar6 = vecGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data.ptr;
                if (lVar13 == 9) {
                  vecGroup.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.ptr = (TestCaseGroup *)0x0;
                  tcu::TestNode::addChild((TestNode *)this,&pTVar6->super_TestNode);
                  de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  ~UniqueBase(&vecGroup.
                               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                             );
                  return extraout_EAX;
                }
                DVar1 = init::s_matrixTypes[lVar13];
                for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                  pcVar2 = (&sr::(anonymous_namespace)::
                             getIndexAccessTypeName(vkt::sr::(anonymous_namespace)::IndexAccessType)
                             ::s_names)[lVar14];
                  for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
                    pcVar12 = (&sr::(anonymous_namespace)::
                                getIndexAccessTypeName(vkt::sr::(anonymous_namespace)::IndexAccessType)
                                ::s_names)[lVar18];
                    for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 4) {
                      pcVar16 = glu::getShaderTypeName
                                          (*(ShaderType *)
                                            ((long)tessellation::
                                                   createCommonEdgeTests(tcu::TestContext&)::
                                                   primitiveTypes + lVar17));
                      pcVar7 = glu::getDataTypeName(DVar1);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&vertexShaderSource,pcVar7,(allocator<char> *)&local_3a8)
                      ;
                      std::operator+(&fragTemplate.m_template,&vertexShaderSource,"_");
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&params,&fragTemplate.m_template,pcVar2);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&vertTemplate,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&params,"_write_");
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&vertTemplate,pcVar12);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&vtx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&frag,"_read_");
                      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&vtx,pcVar16);
                      std::__cxx11::string::~string((string *)&vtx);
                      std::__cxx11::string::~string((string *)&frag);
                      std::__cxx11::string::~string((string *)&vertTemplate);
                      std::__cxx11::string::~string((string *)&params);
                      std::__cxx11::string::~string((string *)&fragTemplate.m_template);
                      std::__cxx11::string::~string((string *)&vertexShaderSource);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&vertexShaderSource,"Vector subscript access with ",
                                 (allocator<char> *)&local_3a8);
                      std::operator+(&fragTemplate.m_template,&vertexShaderSource,pcVar2);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&params,&fragTemplate.m_template," write and ");
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&vertTemplate,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&params,pcVar12);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&vertTemplate," read in ");
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&vtx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&frag,pcVar16);
                      std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&vtx," shader.");
                      std::__cxx11::string::~string((string *)&vtx);
                      std::__cxx11::string::~string((string *)&frag);
                      std::__cxx11::string::~string((string *)&vertTemplate);
                      std::__cxx11::string::~string((string *)&params);
                      std::__cxx11::string::~string((string *)&fragTemplate);
                      std::__cxx11::string::~string((string *)&vertexShaderSource);
                      pTVar3 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&varyingGroup,name._M_dataplus._M_p,&local_4c9);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_50,desc._M_dataplus._M_p,&local_4ca);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
                      pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&frag;
                      if (lVar17 == 0) {
                        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&vtx;
                      }
                      uVar4 = glu::getDataTypeMatrixNumColumns(DVar1);
                      iVar5 = glu::getDataTypeMatrixNumRows(DVar1);
                      pcVar16 = getIntUniformName(uVar4);
                      dataType = glu::getDataTypeFloatVec(iVar5);
                      std::operator<<((ostream *)&vtx,"#version 310 es\n");
                      std::operator<<((ostream *)&frag,"#version 310 es\n");
                      std::operator<<((ostream *)&vtx,
                                      "layout(location = 0) in highp vec4 a_position;\n");
                      std::operator<<((ostream *)&vtx,
                                      "layout(location = 1) in highp vec4 a_coords;\n");
                      std::operator<<((ostream *)&frag,
                                      "layout(location = 0) out mediump vec4 o_color;\n");
                      if (lVar17 == 0) {
                        std::operator<<((ostream *)&vtx,
                                        "layout(location = 0) out mediump vec4 v_color;\n");
                        pcVar7 = "layout(location = 0) in mediump vec4 v_color;\n";
                      }
                      else {
                        std::operator<<((ostream *)&vtx,
                                        "layout(location = 0) out mediump vec4 v_coords;\n");
                        pcVar7 = "layout(location = 0) in mediump vec4 v_coords;\n";
                      }
                      std::operator<<((ostream *)&frag,pcVar7);
                      if ((((lVar18 == 1 || lVar14 == 1) &&
                           (std::operator<<((ostream *)pbVar15,
                                            "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n"
                                           ), 1 < (int)uVar4)) &&
                          (std::operator<<((ostream *)pbVar15,
                                           "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n"
                                          ), uVar4 != 2)) &&
                         (std::operator<<((ostream *)pbVar15,
                                          "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n"
                                         ), 3 < uVar4)) {
                        std::operator<<((ostream *)pbVar15,
                                        "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n"
                                       );
                      }
                      if (lVar18 == 3 || lVar14 == 3) {
                        poVar11 = std::operator<<((ostream *)pbVar15,"layout(std140, binding = ");
                        poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar4);
                        poVar11 = std::operator<<(poVar11,") uniform something");
                        poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar4);
                        poVar11 = std::operator<<(poVar11," { mediump int ");
                        poVar11 = std::operator<<(poVar11,pcVar16);
                        std::operator<<(poVar11,"; };\n");
                      }
                      std::operator<<((ostream *)&vtx,"\n");
                      std::operator<<((ostream *)&vtx,"void main()\n");
                      std::operator<<((ostream *)&vtx,"{\n");
                      std::operator<<((ostream *)&vtx,"\tgl_Position = a_position;\n");
                      std::operator<<((ostream *)&frag,"\n");
                      std::operator<<((ostream *)&frag,"void main()\n");
                      std::operator<<((ostream *)&frag,"{\n");
                      pcVar7 = "\t${PRECISION} vec4 coords = v_coords;\n";
                      if (lVar17 == 0) {
                        pcVar7 = "\t${PRECISION} vec4 coords = a_coords;\n";
                      }
                      std::operator<<((ostream *)pbVar15,pcVar7);
                      std::operator<<((ostream *)pbVar15,"\t${PRECISION} ${MAT_TYPE} tmp;\n");
                      if (lVar14 == 0) {
                        std::operator<<((ostream *)pbVar15,"\ttmp[0] = ${VEC_TYPE}(coords);\n");
                        if ((1 < (int)uVar4) &&
                           (std::operator<<((ostream *)pbVar15,
                                            "\ttmp[1] = ${VEC_TYPE}(coords.yzwx) * 0.5;\n"),
                           uVar4 != 2)) {
                          std::operator<<((ostream *)pbVar15,
                                          "\ttmp[2] = ${VEC_TYPE}(coords.zwxy) * 0.25;\n");
                          pcVar7 = "\ttmp[3] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
LAB_0058131a:
                          if (3 < uVar4) goto LAB_005813a6;
                        }
                      }
                      else if (lVar14 == 1) {
                        std::operator<<((ostream *)pbVar15,
                                        "\ttmp[ui_zero]  = ${VEC_TYPE}(coords);\n");
                        if ((1 < (int)uVar4) &&
                           (std::operator<<((ostream *)pbVar15,
                                            "\ttmp[ui_one]   = ${VEC_TYPE}(coords.yzwx) * 0.5;\n"),
                           uVar4 != 2)) {
                          std::operator<<((ostream *)pbVar15,
                                          "\ttmp[ui_two]   = ${VEC_TYPE}(coords.zwxy) * 0.25;\n");
                          pcVar7 = "\ttmp[ui_three] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
                          goto LAB_0058131a;
                        }
                      }
                      else {
                        if (lVar14 == 2) {
                          poVar11 = std::operator<<((ostream *)pbVar15,"\tfor (int i = 0; i < ");
                          poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar4);
                        }
                        else {
                          poVar11 = std::operator<<((ostream *)pbVar15,"\tfor (int i = 0; i < ");
                          poVar11 = std::operator<<(poVar11,pcVar16);
                        }
                        std::operator<<(poVar11,"; i++)\n");
                        std::operator<<((ostream *)pbVar15,"\t{\n");
                        std::operator<<((ostream *)pbVar15,"\t\ttmp[i] = ${VEC_TYPE}(coords);\n");
                        std::operator<<((ostream *)pbVar15,"\t\tcoords = coords.yzwx * 0.5;\n");
                        pcVar7 = "\t}\n";
LAB_005813a6:
                        std::operator<<((ostream *)pbVar15,pcVar7);
                      }
                      std::operator<<((ostream *)pbVar15,
                                      "\t${PRECISION} ${VEC_TYPE} res = ${VEC_TYPE}(0.0);\n");
                      if (lVar18 == 0) {
                        std::operator<<((ostream *)pbVar15,"\tres += tmp[0];\n");
                        if ((1 < (int)uVar4) &&
                           (std::operator<<((ostream *)pbVar15,"\tres += tmp[1];\n"), uVar4 != 2)) {
                          std::operator<<((ostream *)pbVar15,"\tres += tmp[2];\n");
                          pcVar16 = "\tres += tmp[3];\n";
LAB_0058145b:
                          if (3 < uVar4) goto LAB_005814b3;
                        }
                      }
                      else if (lVar18 == 1) {
                        std::operator<<((ostream *)pbVar15,"\tres += tmp[ui_zero];\n");
                        if ((1 < (int)uVar4) &&
                           (std::operator<<((ostream *)pbVar15,"\tres += tmp[ui_one];\n"),
                           uVar4 != 2)) {
                          std::operator<<((ostream *)pbVar15,"\tres += tmp[ui_two];\n");
                          pcVar16 = "\tres += tmp[ui_three];\n";
                          goto LAB_0058145b;
                        }
                      }
                      else {
                        if (lVar18 == 2) {
                          poVar11 = std::operator<<((ostream *)pbVar15,"\tfor (int i = 0; i < ");
                          poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar4);
                        }
                        else {
                          poVar11 = std::operator<<((ostream *)pbVar15,"\tfor (int i = 0; i < ");
                          poVar11 = std::operator<<(poVar11,pcVar16);
                        }
                        std::operator<<(poVar11,"; i++)\n");
                        pcVar16 = "\t\tres += tmp[i];\n";
LAB_005814b3:
                        std::operator<<((ostream *)pbVar15,pcVar16);
                      }
                      if (lVar17 == 0) {
                        std::operator<<((ostream *)&vtx,"\tv_color = vec4(res${PADDING});\n");
                        pcVar16 = "\to_color = v_color;\n";
                      }
                      else {
                        std::operator<<((ostream *)&vtx,"\tv_coords = a_coords;\n");
                        pcVar16 = "\to_color = vec4(res${PADDING});\n";
                      }
                      std::operator<<((ostream *)&frag,pcVar16);
                      std::operator<<((ostream *)&vtx,"}\n");
                      std::operator<<((ostream *)&frag,"}\n");
                      params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                      params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
                      ;
                      params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                           &params._M_t._M_impl.super__Rb_tree_header._M_header;
                      params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                      params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                           params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                      fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::pair<const_char_(&)[9],_const_char_*,_true>
                                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&vertTemplate,(char (*) [9])"MAT_TYPE",(char **)&fragTemplate);
                      std::
                      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                  *)&params,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&vertTemplate);
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&vertTemplate);
                      fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(dataType);
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::pair<const_char_(&)[9],_const_char_*,_true>
                                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&vertTemplate,(char (*) [9])"VEC_TYPE",(char **)&fragTemplate);
                      std::
                      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                  *)&params,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&vertTemplate);
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&vertTemplate);
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&vertTemplate,(char (*) [10])0x991f1f,(char (*) [8])0x9ce6fa);
                      std::
                      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                  *)&params,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&vertTemplate);
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&vertTemplate);
                      if (iVar5 == 3) {
                        std::
                        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x99ba18);
                        std::
                        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                    *)&params,
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&vertTemplate);
                      }
                      else if (iVar5 == 2) {
                        std::
                        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x99ba13)
                        ;
                        std::
                        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                    *)&params,
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&vertTemplate);
                      }
                      else {
                        std::
                        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])0x93caf3);
                        std::
                        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                    *)&params,
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&vertTemplate);
                      }
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&vertTemplate);
                      std::__cxx11::stringbuf::str();
                      tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
                      std::__cxx11::string::~string((string *)&fragTemplate.m_template);
                      std::__cxx11::stringbuf::str();
                      tcu::StringTemplate::StringTemplate
                                ((StringTemplate *)&fragTemplate.m_template,&vertexShaderSource);
                      std::__cxx11::string::~string((string *)&vertexShaderSource);
                      tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
                      tcu::StringTemplate::specialize(&local_3a8,&fragTemplate,&params);
                      if (DVar1 - TYPE_FLOAT_MAT2 < 9) {
                        p_Var9 = (ShaderEvalFunc)
                                 (&PTR_evalSubscriptMat2_00bd1dd8)[DVar1 - TYPE_FLOAT_MAT2];
                      }
                      else {
                        p_Var9 = (ShaderEvalFunc)0x0;
                      }
                      pTVar8 = (TestNode *)operator_new(0xe0);
                      ShaderIndexingCase::ShaderIndexingCase
                                ((ShaderIndexingCase *)pTVar8,pTVar3,(string *)&varyingGroup,
                                 &local_50,lVar17 == 0,p_Var9,&vertexShaderSource,&local_3a8,DVar1,
                                 false);
                      std::__cxx11::string::~string((string *)&local_3a8);
                      std::__cxx11::string::~string((string *)&vertexShaderSource);
                      tcu::StringTemplate::~StringTemplate(&fragTemplate);
                      tcu::StringTemplate::~StringTemplate(&vertTemplate);
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~_Rb_tree(&params._M_t);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
                      std::__cxx11::string::~string((string *)&local_50);
                      std::__cxx11::string::~string((string *)&varyingGroup);
                      tcu::TestNode::addChild
                                (&(vecGroup.
                                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                   .m_data.ptr)->super_TestNode,pTVar8);
                      std::__cxx11::string::~string((string *)&desc);
                      std::__cxx11::string::~string((string *)&name);
                    }
                  }
                }
                lVar13 = lVar13 + 1;
              } while( true );
            }
            DVar1 = init::s_vectorTypes[lVar13];
            for (lVar14 = 0; lVar14 != 6; lVar14 = lVar14 + 1) {
              pcVar2 = (char *)(&sr::(anonymous_namespace)::
                                 getVectorAccessTypeName(vkt::sr::(anonymous_namespace)::VectorAccessType)
                                 ::s_names)[lVar14];
              for (lVar18 = 0; lVar18 != 6; lVar18 = lVar18 + 1) {
                pcVar12 = (char *)(&sr::(anonymous_namespace)::
                                    getVectorAccessTypeName(vkt::sr::(anonymous_namespace)::VectorAccessType)
                                    ::s_names)[lVar18];
                for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 4) {
                  pcVar16 = glu::getShaderTypeName
                                      (*(ShaderType *)
                                        ((long)tessellation::
                                               createCommonEdgeTests(tcu::TestContext&)::
                                               primitiveTypes + lVar17));
                  pcVar7 = glu::getDataTypeName(DVar1);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&vertexShaderSource,pcVar7,(allocator<char> *)&local_3a8);
                  std::operator+(&fragTemplate.m_template,&vertexShaderSource,"_");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&params,&fragTemplate.m_template,pcVar2);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&params,"_write_");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&vertTemplate,pcVar12);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vtx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&frag,"_read_");
                  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&vtx,pcVar16);
                  std::__cxx11::string::~string((string *)&vtx);
                  std::__cxx11::string::~string((string *)&frag);
                  std::__cxx11::string::~string((string *)&vertTemplate);
                  std::__cxx11::string::~string((string *)&params);
                  std::__cxx11::string::~string((string *)&fragTemplate.m_template);
                  std::__cxx11::string::~string((string *)&vertexShaderSource);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&vertexShaderSource,"Vector subscript access with ",
                             (allocator<char> *)&local_3a8);
                  std::operator+(&fragTemplate.m_template,&vertexShaderSource,pcVar2);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&params,&fragTemplate.m_template," write and ");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&params,pcVar12);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&vertTemplate," read in ");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vtx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&frag,pcVar16);
                  std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&vtx," shader.");
                  std::__cxx11::string::~string((string *)&vtx);
                  std::__cxx11::string::~string((string *)&frag);
                  std::__cxx11::string::~string((string *)&vertTemplate);
                  std::__cxx11::string::~string((string *)&params);
                  std::__cxx11::string::~string((string *)&fragTemplate);
                  std::__cxx11::string::~string((string *)&vertexShaderSource);
                  pTVar3 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&varyingGroup,name._M_dataplus._M_p,&local_4c9);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_50,desc._M_dataplus._M_p,&local_4ca);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
                  poVar20 = (ostringstream *)&frag;
                  if (lVar17 == 0) {
                    poVar20 = (ostringstream *)&vtx;
                  }
                  uVar4 = glu::getDataTypeScalarSize(DVar1);
                  pcVar16 = getIntUniformName(uVar4);
                  std::operator<<((ostream *)&vtx,"#version 310 es\n");
                  std::operator<<((ostream *)&frag,"#version 310 es\n");
                  std::operator<<((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n"
                                 );
                  std::operator<<((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n");
                  std::operator<<((ostream *)&frag,
                                  "layout(location = 0) out mediump vec4 o_color;\n");
                  if (lVar17 == 0) {
                    std::operator<<((ostream *)&vtx,
                                    "layout(location = 0) out mediump vec3 v_color;\n");
                    pcVar7 = "layout(location = 0) in mediump vec3 v_color;\n";
                  }
                  else {
                    std::operator<<((ostream *)&vtx,
                                    "layout(location = 0) out mediump vec4 v_coords;\n");
                    pcVar7 = "layout(location = 0) in mediump vec4 v_coords;\n";
                  }
                  std::operator<<((ostream *)&frag,pcVar7);
                  if ((((lVar18 == 3 || lVar14 == 3) &&
                       (std::operator<<((ostream *)poVar20,
                                        "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n"
                                       ), 1 < (int)uVar4)) &&
                      (std::operator<<((ostream *)poVar20,
                                       "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n"
                                      ), uVar4 != 2)) &&
                     (std::operator<<((ostream *)poVar20,
                                      "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n"
                                     ), 3 < uVar4)) {
                    std::operator<<((ostream *)poVar20,
                                    "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n"
                                   );
                  }
                  if (lVar18 == 5 || lVar14 == 5) {
                    poVar11 = std::operator<<((ostream *)poVar20,"layout(std140, binding = ");
                    poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar4);
                    poVar11 = std::operator<<(poVar11,") uniform something");
                    poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar4);
                    poVar11 = std::operator<<(poVar11," { mediump int ");
                    poVar11 = std::operator<<(poVar11,pcVar16);
                    std::operator<<(poVar11,"; };\n");
                  }
                  std::operator<<((ostream *)&vtx,"\n");
                  std::operator<<((ostream *)&vtx,"void main()\n");
                  std::operator<<((ostream *)&vtx,"{\n");
                  std::operator<<((ostream *)&vtx,"\tgl_Position = a_position;\n");
                  std::operator<<((ostream *)&frag,"\n");
                  std::operator<<((ostream *)&frag,"void main()\n");
                  std::operator<<((ostream *)&frag,"{\n");
                  pcVar7 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
                  if (lVar17 == 0) {
                    pcVar7 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
                  }
                  std::operator<<((ostream *)poVar20,pcVar7);
                  std::operator<<((ostream *)poVar20,"\t${PRECISION} ${VAR_TYPE} tmp;\n");
                  pcVar7 = "\ttmp = coords.${SWIZZLE} * vec4(1.0, 0.5, 0.25, 0.125).${SWIZZLE};\n";
                  iVar5 = (int)lVar14;
                  if (iVar5 == 0) {
LAB_00580838:
                    std::operator<<((ostream *)poVar20,pcVar7);
                  }
                  else if (iVar5 == 2) {
                    std::operator<<((ostream *)poVar20,"\ttmp[0] = coords.x;\n");
                    if ((1 < (int)uVar4) &&
                       (std::operator<<((ostream *)poVar20,"\ttmp[1] = coords.y * 0.5;\n"),
                       uVar4 != 2)) {
                      std::operator<<((ostream *)poVar20,"\ttmp[2] = coords.z * 0.25;\n");
                      pcVar7 = "\ttmp[3] = coords.w * 0.125;\n";
LAB_005807a5:
                      if (3 < uVar4) goto LAB_00580838;
                    }
                  }
                  else if (iVar5 == 1) {
                    std::operator<<((ostream *)poVar20,"\ttmp.x = coords.x;\n");
                    if ((1 < (int)uVar4) &&
                       (std::operator<<((ostream *)poVar20,"\ttmp.y = coords.y * 0.5;\n"),
                       uVar4 != 2)) {
                      std::operator<<((ostream *)poVar20,"\ttmp.z = coords.z * 0.25;\n");
                      pcVar7 = "\ttmp.w = coords.w * 0.125;\n";
                      goto LAB_005807a5;
                    }
                  }
                  else {
                    if (lVar14 != 3) {
                      if (lVar14 == 4) {
                        poVar11 = std::operator<<((ostream *)poVar20,"\tfor (int i = 0; i < ");
                        poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar4);
                      }
                      else {
                        poVar11 = std::operator<<((ostream *)poVar20,"\tfor (int i = 0; i < ");
                        poVar11 = std::operator<<(poVar11,pcVar16);
                      }
                      std::operator<<(poVar11,"; i++)\n");
                      std::operator<<((ostream *)poVar20,"\t{\n");
                      std::operator<<((ostream *)poVar20,"\t\ttmp[i] = coords.x;\n");
                      std::operator<<((ostream *)poVar20,
                                      "\t\tcoords = coords.${ROT_SWIZZLE} * 0.5;\n");
                      pcVar7 = "\t}\n";
                      goto LAB_00580838;
                    }
                    std::operator<<((ostream *)poVar20,"\ttmp[ui_zero]  = coords.x;\n");
                    if ((1 < (int)uVar4) &&
                       (std::operator<<((ostream *)poVar20,"\ttmp[ui_one]   = coords.y * 0.5;\n"),
                       uVar4 != 2)) {
                      std::operator<<((ostream *)poVar20,"\ttmp[ui_two]   = coords.z * 0.25;\n");
                      pcVar7 = "\ttmp[ui_three] = coords.w * 0.125;\n";
                      goto LAB_005807a5;
                    }
                  }
                  std::operator<<((ostream *)poVar20,"\t${PRECISION} float res = 0.0;\n");
                  pcVar7 = "\tres = dot(tmp, ${VAR_TYPE}(1.0));\n";
                  local_460 = (int)lVar18;
                  if (local_460 == 0) {
LAB_005809ba:
                    std::operator<<((ostream *)poVar20,pcVar7);
                  }
                  else if (local_460 == 2) {
                    std::operator<<((ostream *)poVar20,"\tres += tmp[0];\n");
                    if ((1 < (int)uVar4) &&
                       (std::operator<<((ostream *)poVar20,"\tres += tmp[1];\n"), uVar4 != 2)) {
                      std::operator<<((ostream *)poVar20,"\tres += tmp[2];\n");
                      pcVar7 = "\tres += tmp[3];\n";
LAB_0058095b:
                      if (3 < uVar4) goto LAB_005809ba;
                    }
                  }
                  else if (local_460 == 1) {
                    std::operator<<((ostream *)poVar20,"\tres += tmp.x;\n");
                    if ((1 < (int)uVar4) &&
                       (std::operator<<((ostream *)poVar20,"\tres += tmp.y;\n"), uVar4 != 2)) {
                      std::operator<<((ostream *)poVar20,"\tres += tmp.z;\n");
                      pcVar7 = "\tres += tmp.w;\n";
                      goto LAB_0058095b;
                    }
                  }
                  else {
                    if (lVar18 != 3) {
                      if (lVar18 == 4) {
                        poVar11 = std::operator<<((ostream *)poVar20,"\tfor (int i = 0; i < ");
                        poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar4);
                      }
                      else {
                        poVar11 = std::operator<<((ostream *)poVar20,"\tfor (int i = 0; i < ");
                        poVar11 = std::operator<<(poVar11,pcVar16);
                      }
                      std::operator<<(poVar11,"; i++)\n");
                      pcVar7 = "\t\tres += tmp[i];\n";
                      goto LAB_005809ba;
                    }
                    std::operator<<((ostream *)poVar20,"\tres += tmp[ui_zero];\n");
                    if ((1 < (int)uVar4) &&
                       (std::operator<<((ostream *)poVar20,"\tres += tmp[ui_one];\n"), uVar4 != 2))
                    {
                      std::operator<<((ostream *)poVar20,"\tres += tmp[ui_two];\n");
                      pcVar7 = "\tres += tmp[ui_three];\n";
                      goto LAB_0058095b;
                    }
                  }
                  if (lVar17 == 0) {
                    std::operator<<((ostream *)&vtx,"\tv_color = vec3(res);\n");
                    pcVar16 = "\to_color = vec4(v_color.rgb, 1.0);\n";
                  }
                  else {
                    std::operator<<((ostream *)&vtx,"\tv_coords = a_coords;\n");
                    pcVar16 = "\to_color = vec4(vec3(res), 1.0);\n";
                  }
                  std::operator<<((ostream *)&frag,pcVar16);
                  std::operator<<((ostream *)&vtx,"}\n");
                  std::operator<<((ostream *)&frag,"}\n");
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &params._M_t._M_impl.super__Rb_tree_header._M_header;
                  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<const_char_(&)[9],_const_char_*,_true>
                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate,(char (*) [9])0x991f0e,(char **)&fragTemplate);
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              *)&params,
                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&vertTemplate);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate,(char (*) [10])0x991f1f,(char (*) [8])0x9ce6fa);
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              *)&params,
                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&vertTemplate);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<const_char_(&)[8],_const_char_*&,_true>
                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate,(char (*) [8])0x991615,
                             (char **)(sr::(anonymous_namespace)::
                                       createVectorSubscriptCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,glu::DataType,vkt::sr::(anonymous_namespace)::VectorAccessType,vkt::sr::(anonymous_namespace)::VectorAccessType)
                                       ::s_swizzles + (long)(int)uVar4 * 8));
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              *)&params,
                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&vertTemplate);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<const_char_(&)[12],_const_char_*&,_true>
                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate,(char (*) [12])"ROT_SWIZZLE",
                             (char **)(sr::(anonymous_namespace)::
                                       createVectorSubscriptCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,glu::DataType,vkt::sr::(anonymous_namespace)::VectorAccessType,vkt::sr::(anonymous_namespace)::VectorAccessType)
                                       ::s_rotSwizzles + (long)(int)uVar4 * 8));
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              *)&params,
                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vertTemplate);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&vertTemplate);
                  std::__cxx11::stringbuf::str();
                  tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
                  std::__cxx11::string::~string((string *)&fragTemplate.m_template);
                  std::__cxx11::stringbuf::str();
                  tcu::StringTemplate::StringTemplate
                            ((StringTemplate *)&fragTemplate.m_template,&vertexShaderSource);
                  std::__cxx11::string::~string((string *)&vertexShaderSource);
                  tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
                  tcu::StringTemplate::specialize(&local_3a8,&fragTemplate,&params);
                  if (DVar1 - TYPE_FLOAT_VEC2 < 3) {
                    p_Var9 = (ShaderEvalFunc)
                             (&PTR_evalSubscriptVec2_00bd1dc0)[DVar1 - TYPE_FLOAT_VEC2];
                  }
                  else {
                    p_Var9 = (ShaderEvalFunc)0x0;
                  }
                  pTVar8 = (TestNode *)operator_new(0xe0);
                  ShaderIndexingCase::ShaderIndexingCase
                            ((ShaderIndexingCase *)pTVar8,pTVar3,(string *)&varyingGroup,&local_50,
                             lVar17 == 0,p_Var9,&vertexShaderSource,&local_3a8,DVar1,false);
                  std::__cxx11::string::~string((string *)&local_3a8);
                  std::__cxx11::string::~string((string *)&vertexShaderSource);
                  tcu::StringTemplate::~StringTemplate(&fragTemplate);
                  tcu::StringTemplate::~StringTemplate(&vertTemplate);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~_Rb_tree(&params._M_t);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
                  std::__cxx11::string::~string((string *)&local_50);
                  std::__cxx11::string::~string((string *)&varyingGroup);
                  tcu::TestNode::addChild
                            (&(vecGroup.
                               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                               .m_data.ptr)->super_TestNode,pTVar8);
                  std::__cxx11::string::~string((string *)&desc);
                  std::__cxx11::string::~string((string *)&name);
                }
              }
            }
            lVar13 = lVar13 + 1;
          } while( true );
        }
        DVar1 = sr::(anonymous_namespace)::ShaderOperatorTests::init()::s_floatTypes[lVar13];
        for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
          pcVar2 = (&sr::(anonymous_namespace)::
                     getIndexAccessTypeName(vkt::sr::(anonymous_namespace)::IndexAccessType)::
                     s_names)[lVar14];
          pcVar12 = "\tfor (int i = 0; i < ui_four; i++)\n";
          if (lVar14 == 2) {
            pcVar12 = "\tfor (int i = 0; i < 4; i++)\n";
          }
          for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 4) {
            pcVar16 = glu::getShaderTypeName
                                (*(ShaderType *)
                                  ((long)tessellation::createCommonEdgeTests(tcu::TestContext&)::
                                         primitiveTypes + lVar18));
            pcVar7 = glu::getDataTypeName(DVar1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&params,pcVar7,(allocator<char> *)&fragTemplate.m_template);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &vertTemplate,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate,pcVar2);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &frag,"_read_");
            std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vtx,pcVar16);
            std::__cxx11::string::~string((string *)&vtx);
            std::__cxx11::string::~string((string *)&frag);
            std::__cxx11::string::~string((string *)&vertTemplate);
            std::__cxx11::string::~string((string *)&params);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&params,"Uniform array with ",
                       (allocator<char> *)&fragTemplate.m_template);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &vertTemplate,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,pcVar2);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate," read in ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &frag,pcVar16);
            std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vtx," shader.");
            std::__cxx11::string::~string((string *)&vtx);
            std::__cxx11::string::~string((string *)&frag);
            std::__cxx11::string::~string((string *)&vertTemplate);
            std::__cxx11::string::~string((string *)&params);
            pTVar3 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
            pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag;
            if (lVar18 == 0) {
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx;
            }
            std::operator<<((ostream *)&vtx,"#version 310 es\n");
            std::operator<<((ostream *)&frag,"#version 310 es\n");
            std::operator<<((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n");
            std::operator<<((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n");
            std::operator<<((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n");
            if (lVar18 == 0) {
              std::operator<<((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_color;\n");
              pcVar16 = "layout(location = 0) in mediump vec4 v_color;\n";
            }
            else {
              std::operator<<((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_coords;\n");
              pcVar16 = "layout(location = 0) in mediump vec4 v_coords;\n";
            }
            std::operator<<((ostream *)&frag,pcVar16);
            if (lVar14 == 1) {
              std::operator<<((ostream *)pbVar15,
                              "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n"
                             );
              std::operator<<((ostream *)pbVar15,
                              "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n"
                             );
              std::operator<<((ostream *)pbVar15,
                              "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n"
                             );
              pcVar16 = 
              "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n";
LAB_0057f2bd:
              std::operator<<((ostream *)pbVar15,pcVar16);
            }
            else {
              pcVar16 = "layout(std140, binding = 4) uniform something4 { mediump int ui_four; };\n"
              ;
              if (lVar14 == 3) goto LAB_0057f2bd;
            }
            std::operator<<((ostream *)pbVar15,
                            "layout(std140, binding = 5) uniform something5 { ${PRECISION} ${VAR_TYPE} u_arr[${ARRAY_LEN}]; };\n"
                           );
            std::operator<<((ostream *)&vtx,"\n");
            std::operator<<((ostream *)&vtx,"void main()\n");
            std::operator<<((ostream *)&vtx,"{\n");
            std::operator<<((ostream *)&vtx,"\tgl_Position = a_position;\n");
            std::operator<<((ostream *)&frag,"\n");
            std::operator<<((ostream *)&frag,"void main()\n");
            std::operator<<((ostream *)&frag,"{\n");
            std::operator<<((ostream *)pbVar15,
                            "\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n");
            if (lVar14 == 0) {
              std::operator<<((ostream *)pbVar15,"\tres += u_arr[0];\n");
              std::operator<<((ostream *)pbVar15,"\tres += u_arr[1];\n");
              std::operator<<((ostream *)pbVar15,"\tres += u_arr[2];\n");
              pcVar16 = "\tres += u_arr[3];\n";
            }
            else if (lVar14 == 1) {
              std::operator<<((ostream *)pbVar15,"\tres += u_arr[ui_zero];\n");
              std::operator<<((ostream *)pbVar15,"\tres += u_arr[ui_one];\n");
              std::operator<<((ostream *)pbVar15,"\tres += u_arr[ui_two];\n");
              pcVar16 = "\tres += u_arr[ui_three];\n";
            }
            else {
              std::operator<<((ostream *)pbVar15,pcVar12);
              pcVar16 = "\t\tres += u_arr[i];\n";
            }
            std::operator<<((ostream *)pbVar15,pcVar16);
            if (lVar18 == 0) {
              std::operator<<((ostream *)&vtx,"\tv_color = vec4(res${PADDING});\n");
              pcVar16 = "\to_color = v_color;\n";
            }
            else {
              std::operator<<((ostream *)&vtx,"\tv_coords = a_coords;\n");
              pcVar16 = "\to_color = vec4(res${PADDING});\n";
            }
            std::operator<<((ostream *)&frag,pcVar16);
            std::operator<<((ostream *)&vtx,"}\n");
            std::operator<<((ostream *)&frag,"}\n");
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header;
            params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[9],_const_char_*,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [9])0x991f0e,(char **)&fragTemplate.m_template);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&vertTemplate);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x9971d4);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&vertTemplate);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [10])0x991f1f,(char (*) [8])0x9ce6fa);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&vertTemplate);
            if (DVar1 == TYPE_FLOAT_VEC3) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x99ba18);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else if (DVar1 == TYPE_FLOAT_VEC2) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x99ba13);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else if (DVar1 == TYPE_FLOAT) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])0x99ba64);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])0x93caf3);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&vertTemplate);
            std::__cxx11::stringbuf::str();
            tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
            std::__cxx11::string::~string((string *)&fragTemplate.m_template);
            std::__cxx11::stringbuf::str();
            tcu::StringTemplate::StringTemplate
                      ((StringTemplate *)&fragTemplate.m_template,&vertexShaderSource);
            std::__cxx11::string::~string((string *)&vertexShaderSource);
            tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
            tcu::StringTemplate::specialize
                      (&local_3a8,(StringTemplate *)&fragTemplate.m_template,&params);
            if (DVar1 - TYPE_FLOAT < 4) {
              p_Var9 = (ShaderEvalFunc)(&PTR_evalArrayUniformFloat_00bd1da0)[DVar1 - TYPE_FLOAT];
            }
            else {
              p_Var9 = (ShaderEvalFunc)0x0;
            }
            pTVar8 = (TestNode *)operator_new(0xe0);
            ShaderIndexingCase::ShaderIndexingCase
                      ((ShaderIndexingCase *)pTVar8,pTVar3,&name,&desc,lVar18 == 0,p_Var9,
                       &vertexShaderSource,&local_3a8,DVar1,true);
            std::__cxx11::string::~string((string *)&local_3a8);
            std::__cxx11::string::~string((string *)&vertexShaderSource);
            tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragTemplate.m_template);
            tcu::StringTemplate::~StringTemplate(&vertTemplate);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&params);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
            tcu::TestNode::addChild
                      (&(varyingGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data.ptr)->super_TestNode,pTVar8);
            std::__cxx11::string::~string((string *)&desc);
            std::__cxx11::string::~string((string *)&name);
          }
        }
        lVar13 = lVar13 + 1;
      } while( true );
    }
    DVar1 = sr::(anonymous_namespace)::ShaderOperatorTests::init()::s_floatTypes[lVar13];
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      pcVar2 = (&sr::(anonymous_namespace)::
                 getIndexAccessTypeName(vkt::sr::(anonymous_namespace)::IndexAccessType)::s_names)
               [lVar14];
      pcVar12 = "\tfor (int i = 0; i < ui_four; i++)\n";
      if (lVar14 == 2) {
        pcVar12 = "\tfor (int i = 0; i < 4; i++)\n";
      }
      for (lVar18 = -0x20; lVar18 != 0; lVar18 = lVar18 + 8) {
        pcVar16 = *(char **)(&sr::(anonymous_namespace)::ShaderIndexingCase::vtable + lVar18);
        pcVar7 = glu::getDataTypeName(DVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fragTemplate.m_template,pcVar7,(allocator<char> *)&vertexShaderSource)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                       &fragTemplate.m_template,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vertTemplate,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                       pcVar2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vertTemplate,"_write_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       pcVar16);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vtx,"_read");
        std::__cxx11::string::~string((string *)&vtx);
        std::__cxx11::string::~string((string *)&frag);
        std::__cxx11::string::~string((string *)&vertTemplate);
        std::__cxx11::string::~string((string *)&params);
        std::__cxx11::string::~string((string *)&fragTemplate.m_template);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,"Varying array with ",
                   (allocator<char> *)&fragTemplate.m_template);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vertTemplate,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                       pcVar2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vertTemplate," write in vertex shader and ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       pcVar16);
        std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vtx," read in fragment shader.");
        std::__cxx11::string::~string((string *)&vtx);
        std::__cxx11::string::~string((string *)&frag);
        std::__cxx11::string::~string((string *)&vertTemplate);
        std::__cxx11::string::~string((string *)&params);
        pTVar3 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
        std::operator<<((ostream *)&vtx,"#version 310 es\n");
        std::operator<<((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n");
        std::operator<<((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n");
        if (lVar14 == 1) {
          std::operator<<((ostream *)&vtx,
                          "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n"
                         );
          std::operator<<((ostream *)&vtx,
                          "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n"
                         );
          std::operator<<((ostream *)&vtx,
                          "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n"
                         );
          pcVar16 = "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n";
LAB_0057e9c5:
          std::operator<<((ostream *)&vtx,pcVar16);
        }
        else {
          pcVar16 = "layout(std140, binding = 4) uniform something { mediump int ui_four; };\n";
          if (lVar14 == 3) goto LAB_0057e9c5;
        }
        std::operator<<((ostream *)&vtx,
                        "layout(location = 0) out ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n");
        std::operator<<((ostream *)&vtx,"\n");
        std::operator<<((ostream *)&vtx,"void main()\n");
        std::operator<<((ostream *)&vtx,"{\n");
        std::operator<<((ostream *)&vtx,"\tgl_Position = a_position;\n");
        if (lVar14 == 0) {
          std::operator<<((ostream *)&vtx,"\tvar[0] = ${VAR_TYPE}(a_coords);\n");
          std::operator<<((ostream *)&vtx,"\tvar[1] = ${VAR_TYPE}(a_coords) * 0.5;\n");
          std::operator<<((ostream *)&vtx,"\tvar[2] = ${VAR_TYPE}(a_coords) * 0.25;\n");
          pcVar16 = "\tvar[3] = ${VAR_TYPE}(a_coords) * 0.125;\n";
        }
        else if (lVar14 == 1) {
          std::operator<<((ostream *)&vtx,"\tvar[ui_zero]  = ${VAR_TYPE}(a_coords);\n");
          std::operator<<((ostream *)&vtx,"\tvar[ui_one]   = ${VAR_TYPE}(a_coords) * 0.5;\n");
          std::operator<<((ostream *)&vtx,"\tvar[ui_two]   = ${VAR_TYPE}(a_coords) * 0.25;\n");
          pcVar16 = "\tvar[ui_three] = ${VAR_TYPE}(a_coords) * 0.125;\n";
        }
        else {
          std::operator<<((ostream *)&vtx,
                          "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n");
          std::operator<<((ostream *)&vtx,pcVar12);
          std::operator<<((ostream *)&vtx,"\t{\n");
          std::operator<<((ostream *)&vtx,"\t\tvar[i] = ${VAR_TYPE}(coords);\n");
          std::operator<<((ostream *)&vtx,"\t\tcoords = coords * 0.5;\n");
          pcVar16 = "\t}\n";
        }
        std::operator<<((ostream *)&vtx,pcVar16);
        std::operator<<((ostream *)&vtx,"}\n");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
        std::operator<<((ostream *)&frag,"#version 310 es\n");
        std::operator<<((ostream *)&frag,"precision mediump int;\n");
        std::operator<<((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n");
        if (lVar18 == -0x18) {
          std::operator<<((ostream *)&frag,
                          "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n"
                         );
          std::operator<<((ostream *)&frag,
                          "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n"
                         );
          std::operator<<((ostream *)&frag,
                          "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n"
                         );
          pcVar16 = "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n";
LAB_0057ebac:
          std::operator<<((ostream *)&frag,pcVar16);
        }
        else {
          pcVar16 = "layout(std140, binding = 4) uniform something4 { mediump int ui_four; };\n";
          if (lVar18 == -8) goto LAB_0057ebac;
        }
        std::operator<<((ostream *)&frag,
                        "layout(location = 0) in ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n");
        std::operator<<((ostream *)&frag,"\n");
        std::operator<<((ostream *)&frag,"void main()\n");
        std::operator<<((ostream *)&frag,"{\n");
        std::operator<<((ostream *)&frag,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n");
        if (lVar18 == -0x20) {
          std::operator<<((ostream *)&frag,"\tres += var[0];\n");
          std::operator<<((ostream *)&frag,"\tres += var[1];\n");
          std::operator<<((ostream *)&frag,"\tres += var[2];\n");
          pcVar16 = "\tres += var[3];\n";
        }
        else if (lVar18 == -0x18) {
          std::operator<<((ostream *)&frag,"\tres += var[ui_zero];\n");
          std::operator<<((ostream *)&frag,"\tres += var[ui_one];\n");
          std::operator<<((ostream *)&frag,"\tres += var[ui_two];\n");
          pcVar16 = "\tres += var[ui_three];\n";
        }
        else {
          pcVar16 = "\tfor (int i = 0; i < ui_four; i++)\n";
          if (lVar18 == -0x10) {
            pcVar16 = "\tfor (int i = 0; i < 4; i++)\n";
          }
          std::operator<<((ostream *)&frag,pcVar16);
          pcVar16 = "\t\tres += var[i];\n";
        }
        std::operator<<((ostream *)&frag,pcVar16);
        std::operator<<((ostream *)&frag,"\to_color = vec4(res${PADDING});\n");
        std::operator<<((ostream *)&frag,"}\n");
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &params._M_t._M_impl.super__Rb_tree_header._M_header;
        params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[9],_const_char_*,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [9])0x991f0e,(char **)&fragTemplate.m_template);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x9971d4);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])0x991f1f,(char (*) [8])0x9ce6fa);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        if (DVar1 == TYPE_FLOAT_VEC3) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x99ba18);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar1 == TYPE_FLOAT_VEC2) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x99ba13);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar1 == TYPE_FLOAT) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])0x99ba64);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])0x93caf3);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        std::__cxx11::stringbuf::str();
        tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
        std::__cxx11::string::~string((string *)&fragTemplate.m_template);
        std::__cxx11::stringbuf::str();
        tcu::StringTemplate::StringTemplate
                  ((StringTemplate *)&fragTemplate.m_template,&vertexShaderSource);
        std::__cxx11::string::~string((string *)&vertexShaderSource);
        tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
        tcu::StringTemplate::specialize
                  (&local_3a8,(StringTemplate *)&fragTemplate.m_template,&params);
        pTVar8 = (TestNode *)operator_new(0xe0);
        p_Var9 = getArrayCoordsEvalFunc(DVar1);
        ShaderIndexingCase::ShaderIndexingCase
                  ((ShaderIndexingCase *)pTVar8,pTVar3,&name,&desc,true,p_Var9,&vertexShaderSource,
                   &local_3a8,DVar1,false);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)&vertexShaderSource);
        tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragTemplate.m_template);
        tcu::StringTemplate::~StringTemplate(&vertTemplate);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&params._M_t);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
        tcu::TestNode::addChild
                  (&(varyingGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr)->super_TestNode,pTVar8);
        std::__cxx11::string::~string((string *)&desc);
        std::__cxx11::string::~string((string *)&name);
      }
    }
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

void ShaderIndexingTests::init (void)
{
	static const ShaderType s_shaderTypes[] =
	{
		SHADERTYPE_VERTEX,
		SHADERTYPE_FRAGMENT
	};

	static const DataType s_floatAndVecTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4
	};

	// Varying array access cases.
	{
		de::MovePtr<TestCaseGroup> varyingGroup(new TestCaseGroup(m_testCtx, "varying_array", "Varying array access tests."));

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int vertAccess = 0; vertAccess < INDEXACCESS_LAST; vertAccess++)
			{
				for (int fragAccess = 0; fragAccess < INDEXACCESS_LAST; fragAccess++)
				{
					const char* vertAccessName = getIndexAccessTypeName((IndexAccessType)vertAccess);
					const char* fragAccessName = getIndexAccessTypeName((IndexAccessType)fragAccess);
					string name = string(getDataTypeName(varType)) + "_" + vertAccessName + "_write_" + fragAccessName + "_read";
					string desc = string("Varying array with ") + vertAccessName + " write in vertex shader and " + fragAccessName + " read in fragment shader.";
					de::MovePtr<ShaderIndexingCase> testCase(createVaryingArrayCase(m_testCtx, name, desc, varType, (IndexAccessType)vertAccess, (IndexAccessType)fragAccess));
					varyingGroup->addChild(testCase.release());
				}
			}
		}

		addChild(varyingGroup.release());
	}

	// Uniform array access cases.
	{
		de::MovePtr<TestCaseGroup> uniformGroup(new TestCaseGroup(m_testCtx, "uniform_array", "Uniform array access tests."));

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
			{
				const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);
				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					string		name			= string(getDataTypeName(varType)) + "_" + readAccessName + "_read_" + shaderTypeName;
					string		desc			= string("Uniform array with ") + readAccessName + " read in " + shaderTypeName + " shader.";
					bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
					de::MovePtr<ShaderIndexingCase> testCase(createUniformArrayCase(m_testCtx, name, desc, isVertexCase, varType, (IndexAccessType)readAccess));
					uniformGroup->addChild(testCase.release());
				}
			}
		}

		addChild(uniformGroup.release());
	}

	// Temporary array access cases.
	{
		de::MovePtr<TestCaseGroup> tmpGroup(new TestCaseGroup(m_testCtx, "tmp_array", "Temporary array access tests."));

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Temporary array with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						de::MovePtr<ShaderIndexingCase> testCase(createTmpArrayCase(m_testCtx, name, desc, isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
						tmpGroup->addChild(testCase.release());
					}
				}
			}
		}

		addChild(tmpGroup.release());
	}

	// Vector indexing with subscripts.
	{
		de::MovePtr<TestCaseGroup> vecGroup(new TestCaseGroup(m_testCtx, "vector_subscript", "Vector subscript indexing."));

		static const DataType s_vectorTypes[] =
		{
			TYPE_FLOAT_VEC2,
			TYPE_FLOAT_VEC3,
			TYPE_FLOAT_VEC4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_vectorTypes); typeNdx++)
		{
			DataType varType = s_vectorTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < VECTORACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < VECTORACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getVectorAccessTypeName((VectorAccessType)writeAccess);
					const char* readAccessName = getVectorAccessTypeName((VectorAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						de::MovePtr<ShaderIndexingCase> testCase(createVectorSubscriptCase(m_testCtx, name.c_str(), desc.c_str(), isVertexCase, varType, (VectorAccessType)writeAccess, (VectorAccessType)readAccess));
						vecGroup->addChild(testCase.release());
					}
				}
			}
		}

		addChild(vecGroup.release());
	}

	// Matrix indexing with subscripts.
	{
		de::MovePtr<TestCaseGroup> matGroup(new TestCaseGroup(m_testCtx, "matrix_subscript", "Matrix subscript indexing."));

		static const DataType s_matrixTypes[] =
		{
			TYPE_FLOAT_MAT2,
			TYPE_FLOAT_MAT2X3,
			TYPE_FLOAT_MAT2X4,
			TYPE_FLOAT_MAT3X2,
			TYPE_FLOAT_MAT3,
			TYPE_FLOAT_MAT3X4,
			TYPE_FLOAT_MAT4X2,
			TYPE_FLOAT_MAT4X3,
			TYPE_FLOAT_MAT4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_matrixTypes); typeNdx++)
		{
			DataType varType = s_matrixTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						de::MovePtr<ShaderIndexingCase> testCase(createMatrixSubscriptCase(m_testCtx, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
						matGroup->addChild(testCase.release());
					}
				}
			}
		}

		addChild(matGroup.release());
	}
}